

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeWriteCase::iterate(DepthRangeWriteCase *this)

{
  undefined *puVar1;
  GLint location;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLenum GVar9;
  deInt32 x_00;
  char *str;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  TestError *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  char *local_680;
  RGBA local_4f0;
  int iStack_4ec;
  bool isOk;
  int local_4e8;
  int col;
  int step;
  float d;
  float yf;
  float xf;
  int x;
  int y;
  undefined4 local_4a8;
  undefined4 local_4a4;
  float position_1 [16];
  Vec4 color;
  float depth;
  float f;
  int stepNdx;
  float position [16];
  MessageBuilder local_400;
  GLuint local_27c;
  GLint local_278;
  int posLoc;
  int colorLoc;
  allocator<char> local_249;
  string local_248;
  ProgramSources local_228;
  undefined1 local_158 [8];
  ShaderProgram program;
  float depthStep;
  int numDepthSteps;
  Surface referenceFrame;
  Surface renderedFrame;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Random rnd;
  TestLog *log;
  DepthRangeWriteCase *this_local;
  RenderTarget *this_00;
  
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&renderTarget,dVar3);
  pRVar10 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar10->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar4);
  iVar4 = tcu::RenderTarget::getWidth(this_00);
  iVar4 = de::min<int>(0x80,iVar4);
  iVar5 = tcu::RenderTarget::getHeight(this_00);
  iVar5 = de::min<int>(0x80,iVar5);
  iVar6 = tcu::RenderTarget::getWidth(this_00);
  iVar6 = de::Random::getInt((Random *)&renderTarget,0,iVar6 - iVar4);
  iVar7 = tcu::RenderTarget::getHeight(this_00);
  iVar7 = de::Random::getInt((Random *)&renderTarget,0,iVar7 - iVar5);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,iVar4,iVar5);
  tcu::Surface::Surface((Surface *)&depthStep,iVar4,iVar5);
  program.m_program.m_info.linkTimeUs._4_4_ = 0x20;
  program.m_program.m_info.linkTimeUs._0_4_ = 0x3d042108;
  iVar8 = tcu::RenderTarget::getDepthBits(this_00);
  if (iVar8 == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x130);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar10 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  puVar1 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,puVar1,&local_249);
  puVar1 = s_fragmentShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorLoc,puVar1,(allocator<char> *)((long)&posLoc + 3));
  glu::makeVtxFragSources(&local_228,&local_248,(string *)&colorLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_158,pRVar10,&local_228);
  glu::ProgramSources::~ProgramSources(&local_228);
  std::__cxx11::string::~string((string *)&colorLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&posLoc + 3));
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_158);
  if (!bVar2) {
    glu::operator<<((TestLog *)rnd.m_rnd._8_8_,(ShaderProgram *)local_158);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x137);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  local_278 = glwGetUniformLocation(dVar3,"u_color");
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  local_27c = glwGetAttribLocation(dVar3,"a_position");
  this_03 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_400,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_400,(char (*) [15])"glDepthRangef(");
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&this->m_zNear);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&this->m_zFar);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a94734);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_400);
  glwViewport(iVar6,iVar7,iVar4,iVar5);
  glwClear(0x4500);
  glwEnable(0xb71);
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  glwUseProgram(dVar3);
  glwEnableVertexAttribArray(local_27c);
  f = -1.0;
  stepNdx = -0x40800000;
  pfVar12 = tcu::Vector<float,_4>::operator[](this->m_depthCoord,0);
  position[0] = *pfVar12;
  position[1] = 1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  pfVar12 = tcu::Vector<float,_4>::operator[](this->m_depthCoord,1);
  position[4] = *pfVar12;
  position[5] = 1.0;
  position[6] = 1.0;
  position[7] = -1.0;
  pfVar12 = tcu::Vector<float,_4>::operator[](this->m_depthCoord,2);
  position[8] = *pfVar12;
  position[9] = 1.0;
  position[10] = 1.0;
  position[0xb] = 1.0;
  pfVar12 = tcu::Vector<float,_4>::operator[](this->m_depthCoord,3);
  position[0xc] = *pfVar12;
  position[0xd] = 1.0;
  glwDepthFunc(0x207);
  glwDepthRangef(this->m_zNear,this->m_zFar);
  glwUniform4f(local_278,0.0,1.0,0.0,1.0);
  glwVertexAttribPointer(local_27c,4,0x1406,'\0',0,&f);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  GVar9 = glwGetError();
  glu::checkError(GVar9,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0x156);
  glwDepthFunc(0x203);
  glwDepthMask('\0');
  glwDepthRangef(0.0,1.0);
  for (depth = 0.0; (int)depth < 0x20; depth = (float)((int)depth + 1)) {
    fVar13 = (float)(int)depth * 0.032258064;
    fVar14 = fVar13 + fVar13 + -1.0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(position_1 + 0xf),fVar13,fVar13,fVar13,1.0);
    location = local_278;
    local_4a8 = 0xbf800000;
    local_4a4 = 0xbf800000;
    position_1[1] = 1.0;
    position_1[2] = -1.0;
    position_1[3] = 1.0;
    position_1[5] = 1.0;
    position_1[6] = 1.0;
    position_1[7] = -1.0;
    position_1[9] = 1.0;
    position_1[10] = 1.0;
    position_1[0xb] = 1.0;
    position_1[0xd] = 1.0;
    position_1[0] = fVar14;
    position_1[4] = fVar14;
    position_1[8] = fVar14;
    position_1[0xc] = fVar14;
    pfVar12 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)(position_1 + 0xf));
    glwUniform4fv(location,1,pfVar12);
    glwVertexAttribPointer(local_27c,4,0x1406,'\0',0,&local_4a8);
    glwDrawElements(4,6,0x1403,iterate::quadIndices);
  }
  GVar9 = glwGetError();
  glu::checkError(GVar9,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0x172);
  pRVar10 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar10,iVar6,iVar7,(PixelBufferAccess *)&x);
  for (xf = 0.0; fVar13 = xf, iVar4 = tcu::Surface::getHeight((Surface *)&depthStep),
      (int)fVar13 < iVar4; xf = (float)((int)xf + 1)) {
    for (yf = 0.0; fVar13 = yf, iVar4 = tcu::Surface::getWidth((Surface *)&depthStep),
        (int)fVar13 < iVar4; yf = (float)((int)yf + 1)) {
      fVar13 = (float)(int)yf;
      iVar4 = tcu::Surface::getWidth((Surface *)&depthStep);
      d = (fVar13 + 0.5) / (float)iVar4;
      fVar13 = (float)(int)xf;
      iVar4 = tcu::Surface::getHeight((Surface *)&depthStep);
      step = (int)((fVar13 + 0.5) / (float)iVar4);
      fVar13 = triQuadInterpolate(d,(float)step,this->m_depthCoord);
      col = (int)depthRangeTransform(fVar13,this->m_zNear,this->m_zFar);
      fVar13 = ::deFloatFloor((float)col / 0.032258064);
      local_4e8 = (int)fVar13;
      x_00 = ::deRoundFloatToInt32((float)local_4e8 * 0.032258064 * 255.0);
      iStack_4ec = de::clamp<int>(x_00,0,0xff);
      fVar14 = xf;
      fVar13 = yf;
      tcu::RGBA::RGBA(&local_4f0,iStack_4ec,iStack_4ec,iStack_4ec,0xff);
      tcu::Surface::setPixel((Surface *)&depthStep,(int)fVar13,(int)fVar14,local_4f0);
    }
  }
  bVar2 = tcu::fuzzyCompare((TestLog *)rnd.m_rnd._8_8_,"Result","Image comparison result",
                            (Surface *)&depthStep,(Surface *)&referenceFrame.m_pixels.m_cap,0.05,
                            COMPARE_LOG_RESULT);
  if (bVar2) {
    local_680 = "Pass";
  }
  else {
    local_680 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,local_680);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_158);
  tcu::Surface::~Surface((Surface *)&depthStep);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)&renderTarget);
  return STOP;
}

Assistant:

DepthRangeWriteCase::IterateResult DepthRangeWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	const int					viewportW		= de::min(128, renderTarget.getWidth());
	const int					viewportH		= de::min(128, renderTarget.getHeight());
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= VISUALIZE_DEPTH_STEPS;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc		= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc			= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with depth range.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthFunc(GL_ALWAYS);
		glDepthRangef(m_zNear, m_zFar);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		GLU_CHECK();
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glDepthFunc(GL_LEQUAL);
		glDepthMask(GL_FALSE);
		glDepthRangef(0.0f, 1.0f);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};

			glUniform4fv(colorLoc, 1, color.getPtr());
			glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
			glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		}

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}